

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_file.cpp
# Opt level: O2

bool __thiscall csguide_webserver::INIFile::Save(INIFile *this,string *file_path)

{
  pointer pIVar1;
  char cVar2;
  ostream *poVar3;
  INISection *section;
  pointer section_00;
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs,(string *)file_path,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    pIVar1 = (this->sections_).
             super__Vector_base<csguide_webserver::INISection,_std::allocator<csguide_webserver::INISection>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (section_00 = (this->sections_).
                      super__Vector_base<csguide_webserver::INISection,_std::allocator<csguide_webserver::INISection>_>
                      ._M_impl.super__Vector_impl_data._M_start; section_00 != pIVar1;
        section_00 = section_00 + 1) {
      poVar3 = operator<<((ostream *)&ofs,section_00);
      std::operator<<(poVar3,'\n');
    }
  }
  std::ofstream::~ofstream(&ofs);
  return (bool)cVar2;
}

Assistant:

bool INIFile::Save(const std::string& file_path) const {
  std::ofstream ofs(file_path);
  if (!ofs.is_open()) {
    return false;
  }

  for (const auto& section : sections_) {
    ofs << section << '\n';
  }

  return true;
}